

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

string * __thiscall
cmLocalNinjaGenerator::BuildCommandLine
          (string *__return_storage_ptr__,cmLocalNinjaGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cmdLines,string *customStep,cmGeneratorTarget *target)

{
  pointer pbVar1;
  const_iterator __begin2;
  pointer pbVar2;
  size_t sVar3;
  string *source;
  ulong uVar4;
  string sStack_1f8;
  cmCryptoHash hash;
  string local_1c8;
  ostringstream cmd;
  
  pbVar2 = (cmdLines->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (cmdLines->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 == pbVar1) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)&cmGlobalNinjaGenerator::SHELL_NOOP_abi_cxx11_);
  }
  else {
    if (customStep->_M_string_length != 0) {
      uVar4 = 0;
      for (; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
        uVar4 = uVar4 + pbVar2->_M_string_length + 6;
      }
      sVar3 = cmSystemTools::CalculateCommandLineLengthLimit();
      if (sVar3 >> 1 < uVar4) {
        WriteCommandScript((string *)&cmd,this,cmdLines,customStep,target);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"/bin/sh ",(allocator<char> *)&sStack_1f8);
        source = cmGlobalNinjaGenerator::ConvertToNinjaPath
                           ((cmGlobalNinjaGenerator *)
                            (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                            GlobalGenerator,(string *)&cmd);
        cmOutputConverter::ConvertToOutputFormat
                  (&sStack_1f8,
                   &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,source,SHELL);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&sStack_1f8);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        cmCryptoHash::cmCryptoHash(&hash,AlgoSHA256);
        cmCryptoHash::HashFile(&local_1c8,&hash,(string *)&cmd);
        std::__cxx11::string::substr((ulong)&sStack_1f8,(ulong)&local_1c8);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&sStack_1f8);
        std::__cxx11::string::~string((string *)&local_1c8);
        cmCryptoHash::~cmCryptoHash(&hash);
        std::__cxx11::string::~string((string *)&cmd);
        return __return_storage_ptr__;
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmd);
    for (pbVar2 = (cmdLines->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pbVar2 != (cmdLines->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
      if (pbVar2 != (cmdLines->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start) {
        std::operator<<((ostream *)&cmd," && ");
      }
      std::operator<<((ostream *)&cmd,(string *)pbVar2);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmd);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalNinjaGenerator::BuildCommandLine(
  std::vector<std::string> const& cmdLines, std::string const& customStep,
  cmGeneratorTarget const* target) const
{
  // If we have no commands but we need to build a command anyway, use noop.
  // This happens when building a POST_BUILD value for link targets that
  // don't use POST_BUILD.
  if (cmdLines.empty()) {
    return cmGlobalNinjaGenerator::SHELL_NOOP;
  }

  // If this is a custom step then we will have no '$VAR' ninja placeholders.
  // This means we can deal with long command sequences by writing to a script.
  // Do this if the command lines are on the scale of the OS limit.
  if (!customStep.empty()) {
    size_t cmdLinesTotal = 0;
    for (std::string const& cmd : cmdLines) {
      cmdLinesTotal += cmd.length() + 6;
    }
    if (cmdLinesTotal > cmSystemTools::CalculateCommandLineLengthLimit() / 2) {
      std::string const scriptPath =
        this->WriteCommandScript(cmdLines, customStep, target);
      std::string cmd
#ifndef _WIN32
        = "/bin/sh "
#endif
        ;
      cmd += this->ConvertToOutputFormat(
        this->GetGlobalNinjaGenerator()->ConvertToNinjaPath(scriptPath),
        cmOutputConverter::SHELL);

      // Add an unused argument based on script content so that Ninja
      // knows when the command lines change.
      cmd += " ";
      cmCryptoHash hash(cmCryptoHash::AlgoSHA256);
      cmd += hash.HashFile(scriptPath).substr(0, 16);
      return cmd;
    }
  }

  std::ostringstream cmd;
  for (std::vector<std::string>::const_iterator li = cmdLines.begin();
       li != cmdLines.end(); ++li)
#ifdef _WIN32
  {
    if (li != cmdLines.begin()) {
      cmd << " && ";
    } else if (cmdLines.size() > 1) {
      cmd << "cmd.exe /C \"";
    }
    // Put current cmdLine in brackets if it contains "||" because it has
    // higher precedence than "&&" in cmd.exe
    if (li->find("||") != std::string::npos) {
      cmd << "( " << *li << " )";
    } else {
      cmd << *li;
    }
  }
  if (cmdLines.size() > 1) {
    cmd << "\"";
  }
#else
  {
    if (li != cmdLines.begin()) {
      cmd << " && ";
    }
    cmd << *li;
  }
#endif
  return cmd.str();
}